

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pcmpgtw_mips64(uint64_t fs,uint64_t ft)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = fs;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ft;
  return CONCAT44(-(uint)(SUB164(auVar2 ^ _DAT_00d58680,4) < SUB164(auVar1 ^ _DAT_00d58680,4)),
                  -(uint)(SUB164(auVar2 ^ _DAT_00d58680,0) < SUB164(auVar1 ^ _DAT_00d58680,0)));
}

Assistant:

uint64_t helper_pcmpgtw(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 2; i++) {
        vs.uw[i] = -(vs.uw[i] > vt.uw[i]);
    }
    return vs.d;
}